

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Geometry3D.cpp
# Opt level: O1

void __thiscall Assimp::X3DImporter::ParseNode_Geometry3D_Extrusion(X3DImporter *this)

{
  size_t *psVar1;
  FIReader *pFVar2;
  char *pcVar3;
  CX3DImporter_NodeElement *pCVar4;
  pointer paVar5;
  bool bVar6;
  X3DImporter *pXVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  const_iterator __cbeg;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  _List_node_base *p_Var12;
  long lVar13;
  runtime_error *prVar14;
  float *pfVar15;
  long lVar16;
  float *pfVar17;
  long lVar18;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pValue;
  ulong uVar19;
  string *psVar20;
  ulong uVar21;
  iterator iVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  byte bVar27;
  int iVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  string an;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> spine;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> crossSection;
  vector<float,_std::allocator<float>_> orientation;
  CX3DImporter_NodeElement *ne;
  vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_> basis_arr;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> scale;
  vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
  pointset_arr;
  string def;
  string use;
  bool local_1ce;
  bool local_1cd;
  float local_1cc;
  undefined1 local_1c8 [4];
  float fStack_1c4;
  float local_1c0;
  float local_1bc;
  undefined1 local_1b8 [20];
  uint local_1a4;
  ulong local_1a0;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_198;
  ulong local_180;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> local_178;
  ulong local_160;
  vector<float,_std::allocator<float>_> local_158;
  ulong local_140;
  ulong local_138;
  CX3DImporter_NodeElement *local_130;
  float local_128;
  allocator_type local_121;
  ulong local_120;
  vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_> local_118;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> local_f8;
  float local_e0;
  float local_dc;
  float local_d8;
  float local_d4;
  float local_d0;
  float local_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
  local_b8;
  X3DImporter *local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  uint uStack_80;
  uint uStack_7c;
  string local_70;
  string local_50;
  undefined4 extraout_var_00;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_178.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  local_f8.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector2t<float> *)0x0;
  local_f8.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiVector2t<float> *)0x0;
  local_f8.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector2t<float> *)0x0;
  local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_130 = (CX3DImporter_NodeElement *)0x0;
  uVar9 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if ((int)uVar9 < 1) {
    local_1cc = 0.0;
    bVar27 = 1;
    local_1ce = true;
    local_160 = CONCAT71(local_160._1_7_,1);
    local_138 = CONCAT71(local_138._1_7_,1);
    local_1cd = true;
  }
  else {
    uVar21 = 0;
    local_1cc = 0.0;
    local_1cd = true;
    local_138 = CONCAT71(local_138._1_7_,1);
    local_160._0_1_ = 1;
    local_1ce = true;
    local_180 = CONCAT71(local_180._1_7_,1);
    local_1a0 = CONCAT44(local_1a0._4_4_,uVar9);
    do {
      pFVar2 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      iVar28 = (int)uVar21;
      iVar10 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                         (pFVar2,uVar21);
      std::__cxx11::string::string
                ((string *)local_1c8,(char *)CONCAT44(extraout_var,iVar10),(allocator *)&local_118);
      iVar10 = std::__cxx11::string::compare((char *)local_1c8);
      if (iVar10 == 0) {
        iVar10 = (*(((this->mReader)._M_t.
                     super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                     .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                   super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_00,iVar10);
        psVar20 = &local_70;
LAB_006a710b:
        pcVar3 = (char *)psVar20->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar20,0,pcVar3,(ulong)__s);
        uVar9 = (uint)(float)local_1a0;
      }
      else {
        iVar10 = std::__cxx11::string::compare((char *)local_1c8);
        if (iVar10 == 0) {
          iVar10 = (*(((this->mReader)._M_t.
                       super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                       .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                     super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_01,iVar10);
          psVar20 = &local_50;
          goto LAB_006a710b;
        }
        iVar10 = std::__cxx11::string::compare((char *)local_1c8);
        if (((iVar10 != 0) &&
            (iVar10 = std::__cxx11::string::compare((char *)local_1c8), iVar10 != 0)) &&
           (iVar10 = std::__cxx11::string::compare((char *)local_1c8), iVar10 != 0)) {
          iVar10 = std::__cxx11::string::compare((char *)local_1c8);
          if (iVar10 == 0) {
            local_1cd = XML_ReadNode_GetAttrVal_AsBool(this,iVar28);
          }
          else {
            iVar10 = std::__cxx11::string::compare((char *)local_1c8);
            if (iVar10 == 0) {
              bVar8 = XML_ReadNode_GetAttrVal_AsBool(this,iVar28);
              local_138 = CONCAT71(local_138._1_7_,bVar8);
            }
            else {
              iVar10 = std::__cxx11::string::compare((char *)local_1c8);
              if (iVar10 == 0) {
                local_160._0_1_ = XML_ReadNode_GetAttrVal_AsBool(this,iVar28);
              }
              else {
                iVar10 = std::__cxx11::string::compare((char *)local_1c8);
                if (iVar10 == 0) {
                  local_1cc = XML_ReadNode_GetAttrVal_AsFloat(this,iVar28);
                }
                else {
                  iVar10 = std::__cxx11::string::compare((char *)local_1c8);
                  pValue = &local_178;
                  if (iVar10 == 0) {
LAB_006a719c:
                    XML_ReadNode_GetAttrVal_AsArrVec2f(this,iVar28,pValue);
                  }
                  else {
                    iVar10 = std::__cxx11::string::compare((char *)local_1c8);
                    if (iVar10 == 0) {
                      local_1ce = XML_ReadNode_GetAttrVal_AsBool(this,iVar28);
                    }
                    else {
                      iVar10 = std::__cxx11::string::compare((char *)local_1c8);
                      if (iVar10 == 0) {
                        XML_ReadNode_GetAttrVal_AsArrF(this,iVar28,&local_158);
                      }
                      else {
                        iVar10 = std::__cxx11::string::compare((char *)local_1c8);
                        pValue = &local_f8;
                        if (iVar10 == 0) goto LAB_006a719c;
                        iVar10 = std::__cxx11::string::compare((char *)local_1c8);
                        if (iVar10 == 0) {
                          bVar8 = XML_ReadNode_GetAttrVal_AsBool(this,iVar28);
                          local_180 = CONCAT71(local_180._1_7_,bVar8);
                        }
                        else {
                          iVar10 = std::__cxx11::string::compare((char *)local_1c8);
                          if (iVar10 == 0) {
                            XML_ReadNode_GetAttrVal_AsArrVec3f(this,iVar28,&local_198);
                          }
                          else {
                            Throw_IncorrectAttr(this,(string *)local_1c8);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      if (_local_1c8 != (aiVector2t<float>)local_1b8) {
        operator_delete((void *)_local_1c8);
      }
      uVar21 = (ulong)(iVar28 + 1U);
    } while (uVar9 != iVar28 + 1U);
    local_160 = CONCAT71(local_160._1_7_,(undefined1)local_160) & 0xffffffffffffff01;
    bVar27 = (byte)local_180 & 1;
  }
  if (local_50._M_string_length == 0) {
    lVar13 = ((long)local_198.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_198.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    if (lVar13 == 0) {
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize(&local_198,2);
      (local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_start)->x = 0.0;
      (local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_start)->y = 0.0;
      (local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_start)->z = 0.0;
      local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[1].x = 0.0;
      local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[1].y = 1.0;
      local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[1].z = 0.0;
    }
    else if (lVar13 == 1) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
      _local_1c8 = (aiVector2t<float>)local_1b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,
                 "ParseNode_Geometry3D_Extrusion. Spine must have at least two points.","");
      std::runtime_error::runtime_error(prVar14,(string *)local_1c8);
      *(undefined ***)prVar14 = &PTR__runtime_error_0081d260;
      __cxa_throw(prVar14,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_178.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish ==
        local_178.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl
        .super__Vector_impl_data._M_start) {
      std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::resize(&local_178,5);
      (local_178.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
       super__Vector_impl_data._M_start)->x = 1.0;
      (local_178.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
       super__Vector_impl_data._M_start)->y = 1.0;
      local_178.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[1].x = 1.0;
      local_178.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[1].y = -1.0;
      local_178.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[2].x = -1.0;
      local_178.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[2].y = -1.0;
      local_178.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[3].x = -1.0;
      local_178.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[3].y = 1.0;
      local_178.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[4].x = 1.0;
      local_178.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[4].y = 1.0;
    }
    uVar21 = (ulong)((long)local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2) >> 2;
    lVar13 = (long)local_198.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_198.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 2;
    local_a0 = this;
    if (uVar21 < (ulong)(lVar13 * -0x5555555555555555)) {
      if (uVar21 == 1) {
        local_1c8 = (undefined1  [4])
                    local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start[0];
        fStack_1c4 = local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[1];
        local_1c0 = ((aiVector2t<float> *)
                    ((long)local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start + 8))->x;
        local_1bc = ((aiVector2t<float> *)
                    ((long)local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start + 8))->y;
      }
      else {
        local_1c8 = (undefined1  [4])0x0;
        fStack_1c4 = 0.0;
        local_1c0 = 1.0;
        local_1bc = 0.0;
      }
      local_180 = CONCAT71(local_180._1_7_,bVar27);
      std::vector<float,_std::allocator<float>_>::reserve(&local_158,lVar13 * -0x5555555555555554);
      lVar13 = ((long)local_198.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_198.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 - uVar21;
      if (lVar13 != 0) {
        do {
          if (local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)&local_158,
                       (iterator)
                       local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,(float *)local_1c8);
          }
          else {
            *local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish = (float)local_1c8;
            local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          if (local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)&local_158,
                       (iterator)
                       local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,(float *)(local_1c8 + 4));
          }
          else {
            *local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish = fStack_1c4;
            local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          if (local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)&local_158,
                       (iterator)
                       local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_1c0);
          }
          else {
            *local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish = local_1c0;
            local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          if (local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)&local_158,
                       (iterator)
                       local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_1bc);
          }
          else {
            *local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish = local_1bc;
            local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      bVar27 = (byte)local_180;
    }
    pXVar7 = local_a0;
    if (((int)local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish -
         (int)local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start & 0xcU) != 0) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
      _local_1c8 = (aiVector2t<float>)local_1b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,
                 "Attribute \"orientation\" in <Extrusion> must has multiple four quantity of numbers."
                 ,"");
      std::runtime_error::runtime_error(prVar14,(string *)local_1c8);
      *(undefined ***)prVar14 = &PTR__runtime_error_0081d260;
      __cxa_throw(prVar14,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar21 = ((long)local_198.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_198.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    if ((ulong)((long)local_f8.
                      super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_f8.
                      super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) < uVar21) {
      if ((long)local_f8.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_f8.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start == 8) {
        _local_1c8 = *local_f8.
                      super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start;
      }
      else {
        local_1c8 = (undefined1  [4])0x3f800000;
        fStack_1c4 = 1.0;
      }
      std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::reserve(&local_f8,uVar21)
      ;
      lVar13 = ((long)local_198.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_198.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 -
               ((long)local_f8.
                      super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_f8.
                      super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3);
      if (lVar13 != 0) {
        do {
          if (local_f8.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_f8.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector2t<float>,std::allocator<aiVector2t<float>>>::
            _M_realloc_insert<aiVector2t<float>const&>
                      ((vector<aiVector2t<float>,std::allocator<aiVector2t<float>>> *)&local_f8,
                       (iterator)
                       local_f8.
                       super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(aiVector2t<float> *)local_1c8);
          }
          else {
            *local_f8.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish = _local_1c8;
            local_f8.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_f8.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
    }
    local_130 = (CX3DImporter_NodeElement *)operator_new(0xf0);
    pCVar4 = pXVar7->NodeElement_Cur;
    local_130->Type = ENET_Extrusion;
    (local_130->ID)._M_dataplus._M_p = (pointer)&(local_130->ID).field_2;
    (local_130->ID)._M_string_length = 0;
    (local_130->ID).field_2._M_local_buf[0] = '\0';
    local_130->Parent = pCVar4;
    (local_130->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_130->Child;
    (local_130->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_130->Child;
    (local_130->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    local_130[1]._vptr_CX3DImporter_NodeElement = (_func_int **)0x0;
    *(undefined8 *)&local_130[1].Type = 0;
    *(CX3DImporter_NodeElement **)&local_130[1].Type = local_130 + 1;
    local_130[1]._vptr_CX3DImporter_NodeElement = (_func_int **)(local_130 + 1);
    local_130[1].ID._M_dataplus._M_p = (pointer)0x0;
    local_130[1].ID._M_string_length = 0;
    local_130[1].ID.field_2._M_local_buf[0] = '\x01';
    local_130->_vptr_CX3DImporter_NodeElement =
         (_func_int **)&PTR__CX3DImporter_NodeElement_IndexedSet_008f08e0;
    *(undefined8 *)((long)&local_130[1].ID.field_2 + 8) = 0;
    local_130[1].Parent = (CX3DImporter_NodeElement *)0x0;
    local_130[1].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    local_130[1].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    local_130[2]._vptr_CX3DImporter_NodeElement = (_func_int **)0x0;
    *(undefined8 *)&local_130[2].Type = 0;
    *(undefined8 *)((long)&local_130[2].ID.field_2 + 8) = 0;
    local_130[2].ID._M_string_length = 0;
    local_130[2].ID.field_2._M_allocated_capacity = 0;
    local_130[2].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    local_130[2].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    local_130[2].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    if (local_70._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&local_130->ID);
    }
    pCVar4 = local_130;
    local_130[1].ID.field_2._M_local_buf[1] = (byte)local_138 & 1;
    *(undefined1 *)
     ((long)&local_130[1].Child.
             super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
             ._M_impl._M_node.super__List_node_base._M_prev + 1) = (undefined1)local_160;
    *(float *)&local_130[2].ID._M_dataplus._M_p = local_1cc;
    local_130[1].ID.field_2._M_local_buf[0] = bVar27;
    local_118.super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_118.super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_160 = 0;
    local_b8.
    super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8.
    super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar21 = (long)local_178.
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_178.
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    if (3 < uVar21) {
      uVar23 = 3;
      local_160 = 0;
LAB_006a77ba:
      lVar13 = (uVar21 - 1) - uVar23;
      pfVar15 = &local_178.
                 super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar23 + 1].y;
      uVar19 = uVar23;
      do {
        if (((local_178.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start)->x ==
             local_178.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar19].x) &&
           (!NAN((local_178.
                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start)->x) &&
            !NAN(local_178.
                 super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar19].x))) {
          if (((local_178.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->y ==
               local_178.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar19].y) &&
             (!NAN((local_178.
                    super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start)->y) &&
              !NAN(local_178.
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar19].y))) {
            uVar23 = uVar19 + 1;
            bVar8 = uVar23 < uVar21;
            if (!bVar8) goto LAB_006a7831;
            lVar25 = 0;
            while( true ) {
              if ((local_178.
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar25 + 1].x !=
                   pfVar15[lVar25 * 2 + -1]) ||
                 (NAN(local_178.
                      super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar25 + 1].x) ||
                  NAN(pfVar15[lVar25 * 2 + -1]))) break;
              if ((local_178.
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar25 + 1].y != pfVar15[lVar25 * 2]) ||
                 (NAN(local_178.
                      super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar25 + 1].y) ||
                  NAN(pfVar15[lVar25 * 2]))) break;
              lVar25 = lVar25 + 1;
              if (lVar13 == lVar25) {
                bVar8 = false;
                goto LAB_006a7831;
              }
            }
          }
        }
        uVar19 = uVar19 + 1;
        lVar13 = lVar13 + -1;
        pfVar15 = pfVar15 + 2;
      } while (uVar19 < uVar21);
    }
LAB_006a7859:
    uVar21 = ((long)local_198.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_198.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    local_1a4 = 0;
    if (3 < uVar21) {
      local_1a4 = 0;
      uVar23 = 3;
LAB_006a8572:
      lVar13 = uVar23 * 0xc;
      do {
        if (((local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start)->x ==
             local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar23].x) &&
           (!NAN((local_198.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start)->x) &&
            !NAN(local_198.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar23].x))) {
          paVar5 = local_198.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar23;
          if (((local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->y == paVar5->y) &&
             (!NAN((local_198.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start)->y) && !NAN(paVar5->y))) {
            if (((local_198.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start)->z == paVar5->z) &&
               (!NAN((local_198.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start)->z) && !NAN(paVar5->z))) {
              uVar19 = uVar23 + 1;
              pfVar15 = &local_198.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start[1].z;
              uVar26 = uVar19;
              while( true ) {
                if (uVar21 <= uVar26) {
                  if (paVar5 != local_198.
                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish) {
                    local_198.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish = paVar5;
                  }
                  local_1a4 = (uint)CONCAT71((int7)(uVar23 >> 8),1);
                  uVar23 = uVar19;
                  if (uVar19 != uVar21 && uVar21 > uVar26) goto LAB_006a8572;
                  goto LAB_006a7882;
                }
                pfVar17 = (float *)((long)pfVar15 + lVar13 + -8);
                if (((((((aiVector3t<float> *)(pfVar15 + -2))->x != *pfVar17) ||
                      (NAN(((aiVector3t<float> *)(pfVar15 + -2))->x) || NAN(*pfVar17))) ||
                     (pfVar17 = (float *)((long)pfVar15 + lVar13 + -4), pfVar15[-1] != *pfVar17)) ||
                    ((NAN(pfVar15[-1]) || NAN(*pfVar17) ||
                     (*pfVar15 != *(float *)((long)pfVar15 + lVar13))))) ||
                   (NAN(*pfVar15) || NAN(*(float *)((long)pfVar15 + lVar13)))) break;
                uVar26 = uVar26 + 1;
                pfVar15 = pfVar15 + 3;
              }
            }
          }
        }
        uVar23 = uVar23 + 1;
        lVar13 = lVar13 + 0xc;
      } while (uVar23 != uVar21);
    }
LAB_006a7882:
    bVar8 = false;
    if ((char)local_1a4 != '\0') {
      bVar8 = local_1ce;
    }
    std::vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>::resize
              (&local_118,
               ((long)local_198.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_198.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555);
    if ((long)local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar13 = ((long)local_198.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_198.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
      local_c8 = 0;
      uStack_c0 = 0;
      uVar21 = 0;
      fVar30 = 0.0;
      do {
        lVar25 = (long)local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        uVar23 = (lVar25 >> 2) * -0x5555555555555555 - 1;
        if ((uVar21 == 0) || (uVar23 == uVar21)) {
          if ((local_1a4 & 1) == 0) {
            if (uVar21 == 0) {
              fVar31 = local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[1].x -
                       (local_198.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start)->x;
              fVar29 = local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[1].y -
                       (local_198.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start)->y;
              pfVar15 = &local_198.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start[1].z;
              pfVar17 = &(local_198.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->z;
            }
            else {
              pfVar17 = (float *)((long)local_198.
                                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar25 + -0x10);
              pfVar15 = &local_198.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar23].z;
              fVar31 = ((aiVector3t<float> *)(pfVar15 + -2))->x -
                       *(float *)((long)local_198.
                                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar25 + -0x18);
              fVar29 = pfVar15[-1] -
                       *(float *)((long)local_198.
                                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar25 + -0x14);
            }
          }
          else {
            paVar5 = local_198.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar23;
            pfVar17 = &paVar5->z;
            fVar31 = local_198.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[1].x - paVar5->x;
            fVar29 = local_198.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[1].y - paVar5->y;
            pfVar15 = &local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[1].z;
          }
        }
        else {
          pfVar17 = &local_198.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar21 - 1].z;
          pfVar15 = &local_198.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar21 + 1].z;
          fVar31 = ((aiVector3t<float> *)(pfVar15 + -2))->x - pfVar15[-8];
          fVar29 = pfVar15[-1] - pfVar15[-7];
        }
        fVar33 = *pfVar15 - *pfVar17;
        local_180 = CONCAT44(local_180._4_4_,fVar31);
        local_120 = CONCAT44(local_120._4_4_,fVar33);
        fVar31 = fVar33 * fVar33 + fVar31 * fVar31 + fVar29 * fVar29;
        if (fVar31 < 0.0) {
          local_1a0 = CONCAT44(local_1a0._4_4_,fVar30);
          fVar31 = sqrtf(fVar31);
          fVar30 = (float)local_1a0;
        }
        else {
          fVar31 = SQRT(fVar31);
        }
        uVar23 = ((long)local_198.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_198.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
        if (uVar23 < 3) {
LAB_006a7a51:
          fVar33 = 1.0;
          local_88 = 0.0;
          local_98 = 0.0;
          uStack_80 = 0;
          uStack_7c = 0;
        }
        else {
          uVar23 = uVar23 - 1;
          if (uVar21 == 0) {
            if ((local_1a4 & 1) == 0) {
              pfVar15 = &local_198.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start[2].z;
              uVar19 = 3;
              do {
                fVar35 = ((aiVector3t<float> *)(pfVar15 + -2))->x - pfVar15[-5];
                fVar34 = pfVar15[-1] - pfVar15[-4];
                fVar32 = *pfVar15 - pfVar15[-3];
                fVar37 = pfVar15[-8] - pfVar15[-5];
                fVar33 = pfVar15[-7] - pfVar15[-4];
                fVar36 = pfVar15[-6] - pfVar15[-3];
                local_88 = fVar34 * fVar36 - fVar33 * fVar32;
                local_98 = fVar32 * fVar37 - fVar36 * fVar35;
                fVar33 = fVar33 * fVar35 - fVar37 * fVar34;
                bVar6 = true;
                if ((ABS(local_88) <= 1e-06) && (ABS(local_98) <= 1e-06)) {
                  bVar6 = 1e-06 < ABS(fVar33);
                }
                if (uVar23 < uVar19) break;
                uVar19 = uVar19 + 1;
                pfVar15 = pfVar15 + 3;
              } while (!bVar6);
              if (!bVar6) goto LAB_006a7a51;
              uStack_80 = 0;
              uStack_7c = 0;
            }
            else {
              fVar32 = local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[1].x -
                       (local_198.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start)->x;
              fVar36 = local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[1].y -
                       (local_198.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start)->y;
              fVar35 = local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[1].z -
                       (local_198.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start)->z;
              fVar34 = local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar23].x -
                       (local_198.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start)->x;
              fVar33 = local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar23].y -
                       (local_198.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start)->y;
              fVar37 = local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar23].z -
                       (local_198.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start)->z;
              local_88 = fVar36 * fVar37 - fVar33 * fVar35;
              local_98 = fVar35 * fVar34 - fVar37 * fVar32;
              uStack_80 = 0;
              uStack_7c = 0;
              fVar33 = fVar33 * fVar32 - fVar34 * fVar36;
            }
          }
          else {
            if (uVar23 == uVar21) {
              fVar33 = fVar30;
              local_88 = (float)local_c8;
              local_98 = local_c8._4_4_;
              uStack_80 = (uint)uStack_c0;
              uStack_7c = uStack_c0._4_4_;
              if ((local_1a4 & 1) == 0) goto LAB_006a7a59;
              fVar35 = (local_198.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start)->x -
                       local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar21].x;
              fVar34 = (local_198.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start)->y -
                       local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar21].y;
              fVar32 = (local_198.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start)->z -
                       local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar21].z;
              fVar37 = local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar21 - 1].x -
                       local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar21].x;
              fVar33 = local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar21 - 1].y -
                       local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar21].y;
              fVar36 = local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar21 - 1].z -
                       local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar21].z;
              local_88 = fVar34 * fVar36 - fVar33 * fVar32;
              local_98 = fVar32 * fVar37 - fVar36 * fVar35;
              fVar33 = fVar33 * fVar35 - fVar37 * fVar34;
            }
            else {
              fVar35 = local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar21 + 1].x -
                       local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar21].x;
              fVar36 = local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar21 + 1].y -
                       local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar21].y;
              fVar32 = local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar21 + 1].z -
                       local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar21].z;
              fVar37 = local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar21 - 1].x -
                       local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar21].x;
              fVar33 = local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar21 - 1].y -
                       local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar21].y;
              fVar34 = local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar21 - 1].z -
                       local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar21].z;
              local_88 = fVar36 * fVar34 - fVar33 * fVar32;
              local_98 = fVar32 * fVar37 - fVar34 * fVar35;
              fVar33 = fVar33 * fVar35 - fVar37 * fVar36;
            }
            uStack_7c = 0;
            uStack_80 = 0;
            if (ABS(local_88) <= 1e-06) {
              uStack_80 = 0;
              uStack_7c = 0;
              if ((ABS(local_98) <= 1e-06) && (ABS(fVar33) <= 1e-06)) {
                fVar33 = fVar30;
                local_88 = (float)local_c8;
                local_98 = local_c8._4_4_;
                uStack_80 = (uint)uStack_c0;
                uStack_7c = uStack_c0._4_4_;
              }
            }
          }
        }
LAB_006a7a59:
        if (fVar30 * fVar33 + local_c8._4_4_ * local_98 + local_88 * (float)local_c8 < 0.0) {
          local_88 = -local_88;
          fVar33 = -fVar33;
          local_98 = -local_98;
          uStack_80 = uStack_80 ^ 0x80000000;
          uStack_7c = uStack_7c ^ 0x80000000;
        }
        fVar30 = fVar33 * fVar33 + local_88 * local_88 + local_98 * local_98;
        fStack_94 = local_98;
        fStack_90 = local_98;
        fStack_8c = local_98;
        fStack_84 = local_98;
        if (fVar30 < 0.0) {
          local_1a0 = CONCAT44(local_1a0._4_4_,fVar33);
          local_140 = CONCAT44(local_140._4_4_,fVar31);
          fVar30 = sqrtf(fVar30);
          fVar33 = (float)local_1a0;
          fVar31 = (float)local_140;
        }
        else {
          fVar30 = SQRT(fVar30);
        }
        fVar31 = 1.0 / fVar31;
        fVar35 = (float)local_180 * fVar31;
        fVar29 = fVar29 * fVar31;
        fVar31 = (float)local_120 * fVar31;
        fVar30 = 1.0 / fVar30;
        local_88 = local_88 * fVar30;
        local_98 = local_98 * fVar30;
        fVar33 = fVar33 * fVar30;
        fVar32 = fVar29 * fVar33 - local_98 * fVar31;
        local_1a0 = CONCAT44(local_1a0._4_4_,fVar33);
        local_120 = CONCAT44(local_120._4_4_,fVar31);
        local_128 = fVar31 * local_88 - fVar33 * fVar35;
        local_180 = CONCAT44(local_180._4_4_,fVar35);
        fVar30 = fVar35 * local_98 - local_88 * fVar29;
        fVar31 = fVar30 * fVar30 + fVar32 * fVar32 + local_128 * local_128;
        local_140._0_4_ = fVar32;
        if (fVar31 < 0.0) {
          local_c8 = CONCAT44(local_c8._4_4_,fVar30);
          fVar31 = sqrtf(fVar31);
          fVar30 = (float)local_c8;
        }
        else {
          fVar31 = SQRT(fVar31);
        }
        local_c8 = CONCAT44(local_98,local_88);
        uStack_c0 = CONCAT44(fStack_94,fStack_84);
        fVar31 = 1.0 / fVar31;
        local_140 = CONCAT44(local_140._4_4_,(float)local_140 * fVar31);
        local_128 = local_128 * fVar31;
        local_cc = fVar31 * fVar30;
        local_e0 = ((aiVector2t<float> *)
                   ((long)local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start + (uVar21 * 2 + 1) * 8))->y;
        local_d8 = ((aiVector2t<float> *)
                   ((long)local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar21 * 2 * 8))->x;
        local_d0 = ((aiVector2t<float> *)
                   ((long)local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar21 * 2 * 8))->y;
        local_d4 = ((aiVector2t<float> *)
                   ((long)local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start + (uVar21 * 2 + 1) * 8))->x;
        local_dc = cosf(local_e0);
        fVar30 = sinf(local_e0);
        fVar33 = 1.0 - local_dc;
        fVar32 = local_d8 * fVar33;
        fVar37 = fVar32 * local_d0 - local_d4 * fVar30;
        fVar34 = fVar32 * local_d0 + local_d4 * fVar30;
        fVar31 = fVar32 * local_d4 + local_d0 * fVar30;
        fVar35 = fVar32 * local_d4 - local_d0 * fVar30;
        fVar38 = local_d0 * fVar33 * local_d4;
        fVar36 = fVar38 - local_d8 * fVar30;
        fVar38 = fVar38 + local_d8 * fVar30;
        fVar32 = fVar32 * local_d8 + local_dc;
        fVar39 = local_d0 * local_d0 * fVar33 + local_dc;
        fVar30 = fVar33 * local_d4 * local_d4 + local_dc;
        local_118.super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar21].a1 =
             fVar31 * local_cc + fVar32 * (float)local_140 + local_128 * fVar37 + 0.0;
        local_118.super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar21].a2 =
             fVar36 * local_cc + fVar34 * (float)local_140 + local_128 * fVar39 + 0.0;
        local_118.super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar21].a3 =
             local_cc * fVar30 + (float)local_140 * fVar35 + local_128 * fVar38 + 0.0;
        local_118.super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar21].b1 =
             fVar31 * (float)local_120 + fVar32 * (float)local_180 + fVar29 * fVar37 + 0.0;
        local_118.super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar21].b2 =
             fVar36 * (float)local_120 + fVar34 * (float)local_180 + fVar29 * fVar39 + 0.0;
        local_118.super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar21].b3 =
             (float)local_120 * fVar30 + (float)local_180 * fVar35 + fVar29 * fVar38 + 0.0;
        local_118.super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar21].c1 =
             fVar31 * (float)local_1a0 + fVar32 * local_88 + fVar37 * local_98 + 0.0;
        local_118.super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar21].c2 =
             fVar36 * (float)local_1a0 + fVar34 * local_88 + fVar39 * local_98 + 0.0;
        local_118.super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar21].c3 =
             fVar30 * (float)local_1a0 + fVar35 * local_88 + fVar38 * local_98 + 0.0;
        uVar21 = uVar21 + 1;
        fVar30 = (float)local_1a0;
      } while (uVar21 != lVar13 + (ulong)(lVar13 == 0));
    }
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_1c8,
               (long)local_178.
                     super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_178.
                     super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3,&local_121);
    std::
    vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
    ::resize(&local_b8,
             ((long)local_198.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_198.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555);
    if ((long)local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar25 = ((long)local_198.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_198.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
      lVar13 = 0;
      do {
        if ((long)local_178.
                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_178.
                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start != 0) {
          fVar30 = local_f8.
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar13].x;
          fVar29 = local_f8.
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar13].y;
          lVar16 = (long)local_178.
                         super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_178.
                         super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3;
          lVar18 = 8;
          lVar24 = 0;
          do {
            fVar31 = local_178.
                     super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar24].y;
            fVar32 = fVar31 * 0.0;
            fVar33 = local_178.
                     super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar24].x * 0.0 + 0.0;
            *(ulong *)((undefined1 *)((long)_local_1c8 + -8) + lVar18) =
                 CONCAT44(fVar32 + fVar33 + 0.0,
                          fVar30 * local_178.
                                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar24].x + 0.0 +
                          fVar32 + 0.0);
            *(float *)((long)_local_1c8 + lVar18) = fVar33 + fVar29 * fVar31 + 0.0;
            fVar31 = *(float *)((undefined1 *)((long)_local_1c8 + -8) + lVar18);
            fVar33 = *(float *)((undefined1 *)((long)_local_1c8 + -4) + lVar18);
            fVar32 = local_118.
                     super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar13].a3;
            fVar35 = local_118.
                     super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar13].b3;
            fVar34 = *(float *)((long)_local_1c8 + lVar18);
            fVar36 = local_118.
                     super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar13].c3;
            fVar37 = local_198.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar13].z;
            *(ulong *)((undefined1 *)((long)_local_1c8 + -8) + lVar18) =
                 CONCAT44(local_118.
                          super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar13].c2 * fVar34 +
                          local_118.
                          super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar13].b2 * fVar33 +
                          local_118.
                          super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar13].a2 * fVar31 +
                          local_198.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar13].y,
                          local_118.
                          super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar13].c1 * fVar34 +
                          local_118.
                          super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar13].b1 * fVar33 +
                          local_118.
                          super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar13].a1 * fVar31 +
                          local_198.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar13].x);
            *(float *)((long)_local_1c8 + lVar18) =
                 fVar34 * fVar36 + fVar33 * fVar35 + fVar31 * fVar32 + fVar37;
            lVar24 = lVar24 + 1;
            lVar18 = lVar18 + 0xc;
          } while (lVar16 + (ulong)(lVar16 == 0) != lVar24);
        }
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator=
                  (local_b8.
                   super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar13,
                   (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_1c8);
        lVar13 = lVar13 + 1;
      } while (lVar13 != lVar25 + (ulong)(lVar25 == 0));
    }
    if (_local_1c8 != (aiVector2t<float>)0x0) {
      operator_delete((void *)_local_1c8);
    }
    if (bVar8 != false || local_1cd != false) {
      if ((long)local_178.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_178.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0) {
        lVar13 = (long)local_178.
                       super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_178.
                       super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3;
        lVar25 = 0;
        do {
          local_1c8 = (undefined1  [4])(float)lVar25;
          iVar22._M_current = (int *)pCVar4[2]._vptr_CX3DImporter_NodeElement;
          if (iVar22._M_current == *(int **)&pCVar4[2].Type) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)
                       &pCVar4[1].Child.
                        super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                        ._M_impl._M_node._M_size,iVar22,(int *)local_1c8);
          }
          else {
            *iVar22._M_current = (int)(float)lVar25;
            pCVar4[2]._vptr_CX3DImporter_NodeElement =
                 (_func_int **)((long)pCVar4[2]._vptr_CX3DImporter_NodeElement + 4);
          }
          lVar25 = lVar25 + 1;
        } while (lVar13 + (ulong)(lVar13 == 0) != lVar25);
      }
      local_1c8 = (undefined1  [4])0xffffffff;
      iVar22._M_current = (int *)pCVar4[2]._vptr_CX3DImporter_NodeElement;
      if (iVar22._M_current == *(int **)&pCVar4[2].Type) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)
                   &pCVar4[1].Child.
                    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                    ._M_impl._M_node._M_size,iVar22,(int *)local_1c8);
      }
      else {
        *iVar22._M_current = -1;
        pCVar4[2]._vptr_CX3DImporter_NodeElement =
             (_func_int **)((long)pCVar4[2]._vptr_CX3DImporter_NodeElement + 4);
      }
    }
    if (((local_1a4 & 1) == 0) && (local_1ce != false)) {
      lVar13 = ((long)local_b8.
                      super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_b8.
                      super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      lVar25 = (long)local_178.
                     super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_178.
                     super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3;
      if ((ulong)((lVar13 + -1) * lVar25) < (ulong)(lVar25 * lVar13)) {
        fVar30 = (float)((int)lVar25 * ((int)lVar13 + -1));
        do {
          local_1c8 = (undefined1  [4])fVar30;
          iVar22._M_current = (int *)pCVar4[2]._vptr_CX3DImporter_NodeElement;
          if (iVar22._M_current == *(int **)&pCVar4[2].Type) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)
                       &pCVar4[1].Child.
                        super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                        ._M_impl._M_node._M_size,iVar22,(int *)local_1c8);
          }
          else {
            *iVar22._M_current = (int)fVar30;
            pCVar4[2]._vptr_CX3DImporter_NodeElement =
                 (_func_int **)((long)pCVar4[2]._vptr_CX3DImporter_NodeElement + 4);
          }
          fVar30 = (float)((int)fVar30 + 1);
          lVar25 = lVar25 + -1;
        } while (lVar25 != 0);
      }
      local_1c8 = (undefined1  [4])0xffffffff;
      iVar22._M_current = (int *)pCVar4[2]._vptr_CX3DImporter_NodeElement;
      if (iVar22._M_current == *(int **)&pCVar4[2].Type) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)
                   &pCVar4[1].Child.
                    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                    ._M_impl._M_node._M_size,iVar22,(int *)local_1c8);
      }
      else {
        *iVar22._M_current = -1;
        pCVar4[2]._vptr_CX3DImporter_NodeElement =
             (_func_int **)((long)pCVar4[2]._vptr_CX3DImporter_NodeElement + 4);
      }
    }
    local_140 = ((long)local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_198.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 - 1;
    psVar1 = &pCVar4[1].Child.
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    uVar21 = 0;
    do {
      iVar10 = (int)uVar21;
      local_120 = uVar21;
      if (uVar21 == local_140) {
        if ((local_1a4 & 1) == 0) break;
        iVar28 = 0;
      }
      else {
        iVar28 = iVar10 + 1;
      }
      if (local_178.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_178.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        lVar13 = (long)local_178.
                       super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_178.
                       super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3;
        iVar11 = (int)lVar13;
        uVar23 = (ulong)(uint)(iVar28 * iVar11);
        fVar30 = (float)(iVar11 * iVar10);
        local_1a0 = -(ulong)(lVar13 == 0) - lVar13;
        fVar29 = (float)(iVar10 * iVar11);
        uVar21 = 0;
        local_180 = uVar23;
        do {
          fVar31 = (float)uVar23;
          local_1c8 = (undefined1  [4])fVar29;
          if (-uVar21 == lVar13 + -1) {
            if ((local_160 & 1) != 0) {
              if ((local_138 & 1) == 0) {
                iVar22._M_current = (int *)pCVar4[2]._vptr_CX3DImporter_NodeElement;
                if (iVar22._M_current == *(int **)&pCVar4[2].Type) {
                  local_1c8 = (undefined1  [4])fVar30;
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            ((vector<int,_std::allocator<int>_> *)psVar1,iVar22,(int *)local_1c8);
                }
                else {
                  *iVar22._M_current = (int)fVar30;
                  pCVar4[2]._vptr_CX3DImporter_NodeElement =
                       (_func_int **)((long)pCVar4[2]._vptr_CX3DImporter_NodeElement + 4);
                }
                local_1c8 = SUB84(local_180,0);
                iVar22._M_current = (int *)pCVar4[2]._vptr_CX3DImporter_NodeElement;
                if (iVar22._M_current == *(int **)&pCVar4[2].Type) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            ((vector<int,_std::allocator<int>_> *)psVar1,iVar22,(int *)local_1c8);
                }
                else {
                  *iVar22._M_current = (int)local_1c8;
                  pCVar4[2]._vptr_CX3DImporter_NodeElement =
                       (_func_int **)((long)pCVar4[2]._vptr_CX3DImporter_NodeElement + 4);
                }
                iVar22._M_current = (int *)pCVar4[2]._vptr_CX3DImporter_NodeElement;
                if (iVar22._M_current == *(int **)&pCVar4[2].Type) {
                  local_1c8 = (undefined1  [4])fVar31;
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            ((vector<int,_std::allocator<int>_> *)psVar1,iVar22,(int *)local_1c8);
                }
                else {
                  *iVar22._M_current = (int)fVar31;
                  pCVar4[2]._vptr_CX3DImporter_NodeElement =
                       (_func_int **)((long)pCVar4[2]._vptr_CX3DImporter_NodeElement + 4);
                }
                local_1c8 = (undefined1  [4])fVar29;
                iVar22._M_current = (int *)pCVar4[2]._vptr_CX3DImporter_NodeElement;
                if (iVar22._M_current != *(int **)&pCVar4[2].Type) {
                  *iVar22._M_current = (int)fVar29;
                  goto LAB_006a8ae3;
                }
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)psVar1,iVar22,(int *)local_1c8);
              }
              else {
                iVar22._M_current = (int *)pCVar4[2]._vptr_CX3DImporter_NodeElement;
                if (iVar22._M_current == *(int **)&pCVar4[2].Type) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            ((vector<int,_std::allocator<int>_> *)psVar1,iVar22,(int *)local_1c8);
                }
                else {
                  *iVar22._M_current = (int)fVar29;
                  pCVar4[2]._vptr_CX3DImporter_NodeElement =
                       (_func_int **)((long)pCVar4[2]._vptr_CX3DImporter_NodeElement + 4);
                }
                iVar22._M_current = (int *)pCVar4[2]._vptr_CX3DImporter_NodeElement;
                if (iVar22._M_current == *(int **)&pCVar4[2].Type) {
                  local_1c8 = (undefined1  [4])fVar31;
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            ((vector<int,_std::allocator<int>_> *)psVar1,iVar22,(int *)local_1c8);
                }
                else {
                  *iVar22._M_current = (int)fVar31;
                  pCVar4[2]._vptr_CX3DImporter_NodeElement =
                       (_func_int **)((long)pCVar4[2]._vptr_CX3DImporter_NodeElement + 4);
                }
                local_1c8 = SUB84(local_180,0);
                iVar22._M_current = (int *)pCVar4[2]._vptr_CX3DImporter_NodeElement;
                if (iVar22._M_current == *(int **)&pCVar4[2].Type) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            ((vector<int,_std::allocator<int>_> *)psVar1,iVar22,(int *)local_1c8);
                }
                else {
                  *iVar22._M_current = (int)local_1c8;
                  pCVar4[2]._vptr_CX3DImporter_NodeElement =
                       (_func_int **)((long)pCVar4[2]._vptr_CX3DImporter_NodeElement + 4);
                }
                local_1c8 = (undefined1  [4])fVar30;
                iVar22._M_current = (int *)pCVar4[2]._vptr_CX3DImporter_NodeElement;
                if (iVar22._M_current == *(int **)&pCVar4[2].Type) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            ((vector<int,_std::allocator<int>_> *)psVar1,iVar22,(int *)local_1c8);
                }
                else {
                  *iVar22._M_current = (int)fVar30;
LAB_006a8ae3:
                  pCVar4[2]._vptr_CX3DImporter_NodeElement =
                       (_func_int **)((long)pCVar4[2]._vptr_CX3DImporter_NodeElement + 4);
                }
              }
              local_1c8 = (undefined1  [4])0xffffffff;
              iVar22._M_current = (int *)pCVar4[2]._vptr_CX3DImporter_NodeElement;
              if (iVar22._M_current != *(int **)&pCVar4[2].Type) goto LAB_006a8b21;
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)psVar1,iVar22,(int *)local_1c8);
            }
          }
          else {
            if ((local_138 & 1) == 0) {
              local_1c8 = (undefined1  [4])((int)fVar29 + 1);
              iVar22._M_current = (int *)pCVar4[2]._vptr_CX3DImporter_NodeElement;
              if (iVar22._M_current == *(int **)&pCVar4[2].Type) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)psVar1,iVar22,(int *)local_1c8);
              }
              else {
                *iVar22._M_current = (int)local_1c8;
                pCVar4[2]._vptr_CX3DImporter_NodeElement =
                     (_func_int **)((long)pCVar4[2]._vptr_CX3DImporter_NodeElement + 4);
              }
              local_1c8 = (undefined1  [4])((int)fVar31 + 1);
              iVar22._M_current = (int *)pCVar4[2]._vptr_CX3DImporter_NodeElement;
              if (iVar22._M_current == *(int **)&pCVar4[2].Type) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)psVar1,iVar22,(int *)local_1c8);
              }
              else {
                *iVar22._M_current = (int)local_1c8;
                pCVar4[2]._vptr_CX3DImporter_NodeElement =
                     (_func_int **)((long)pCVar4[2]._vptr_CX3DImporter_NodeElement + 4);
              }
              iVar22._M_current = (int *)pCVar4[2]._vptr_CX3DImporter_NodeElement;
              if (iVar22._M_current == *(int **)&pCVar4[2].Type) {
                local_1c8 = (undefined1  [4])fVar31;
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)psVar1,iVar22,(int *)local_1c8);
              }
              else {
                *iVar22._M_current = (int)fVar31;
                pCVar4[2]._vptr_CX3DImporter_NodeElement =
                     (_func_int **)((long)pCVar4[2]._vptr_CX3DImporter_NodeElement + 4);
              }
              local_1c8 = (undefined1  [4])fVar29;
              iVar22._M_current = (int *)pCVar4[2]._vptr_CX3DImporter_NodeElement;
              if (iVar22._M_current != *(int **)&pCVar4[2].Type) {
                *iVar22._M_current = (int)fVar29;
                goto LAB_006a8981;
              }
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)psVar1,iVar22,(int *)local_1c8);
            }
            else {
              iVar22._M_current = (int *)pCVar4[2]._vptr_CX3DImporter_NodeElement;
              if (iVar22._M_current == *(int **)&pCVar4[2].Type) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)psVar1,iVar22,(int *)local_1c8);
              }
              else {
                *iVar22._M_current = (int)fVar29;
                pCVar4[2]._vptr_CX3DImporter_NodeElement =
                     (_func_int **)((long)pCVar4[2]._vptr_CX3DImporter_NodeElement + 4);
              }
              iVar22._M_current = (int *)pCVar4[2]._vptr_CX3DImporter_NodeElement;
              if (iVar22._M_current == *(int **)&pCVar4[2].Type) {
                local_1c8 = (undefined1  [4])fVar31;
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)psVar1,iVar22,(int *)local_1c8);
              }
              else {
                *iVar22._M_current = (int)fVar31;
                pCVar4[2]._vptr_CX3DImporter_NodeElement =
                     (_func_int **)((long)pCVar4[2]._vptr_CX3DImporter_NodeElement + 4);
              }
              local_1c8 = (undefined1  [4])((int)fVar31 + 1);
              iVar22._M_current = (int *)pCVar4[2]._vptr_CX3DImporter_NodeElement;
              if (iVar22._M_current == *(int **)&pCVar4[2].Type) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)psVar1,iVar22,(int *)local_1c8);
              }
              else {
                *iVar22._M_current = (int)local_1c8;
                pCVar4[2]._vptr_CX3DImporter_NodeElement =
                     (_func_int **)((long)pCVar4[2]._vptr_CX3DImporter_NodeElement + 4);
              }
              local_1c8 = (undefined1  [4])((int)fVar29 + 1);
              iVar22._M_current = (int *)pCVar4[2]._vptr_CX3DImporter_NodeElement;
              if (iVar22._M_current == *(int **)&pCVar4[2].Type) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)psVar1,iVar22,(int *)local_1c8);
              }
              else {
                *iVar22._M_current = (int)fVar29 + 1;
LAB_006a8981:
                pCVar4[2]._vptr_CX3DImporter_NodeElement =
                     (_func_int **)((long)pCVar4[2]._vptr_CX3DImporter_NodeElement + 4);
              }
            }
            local_1c8 = (undefined1  [4])0xffffffff;
            iVar22._M_current = (int *)pCVar4[2]._vptr_CX3DImporter_NodeElement;
            if (iVar22._M_current == *(int **)&pCVar4[2].Type) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)psVar1,iVar22,(int *)local_1c8);
            }
            else {
LAB_006a8b21:
              *iVar22._M_current = -1;
              pCVar4[2]._vptr_CX3DImporter_NodeElement =
                   (_func_int **)((long)pCVar4[2]._vptr_CX3DImporter_NodeElement + 4);
            }
          }
          uVar21 = uVar21 - 1;
          uVar23 = (ulong)((int)fVar31 + 1);
          fVar29 = (float)((int)fVar29 + 1);
        } while (local_1a0 != uVar21);
      }
      uVar21 = local_120 + 1;
    } while (uVar21 <= local_140);
    if ((long)local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar13 = ((long)local_198.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_198.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
      local_138 = lVar13 + (ulong)(lVar13 == 0);
      local_1a0 = 0;
      do {
        uVar21 = local_1a0;
        if ((long)local_178.
                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_178.
                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start != 0) {
          lVar13 = (long)local_178.
                         super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_178.
                         super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3;
          lVar13 = lVar13 + (ulong)(lVar13 == 0);
          lVar25 = 0;
          do {
            paVar5 = local_b8.
                     super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar21].
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            p_Var12 = (_List_node_base *)operator_new(0x20);
            *(undefined4 *)&p_Var12[1]._M_prev = *(undefined4 *)((long)&paVar5->z + lVar25);
            p_Var12[1]._M_next = *(_List_node_base **)((long)&paVar5->x + lVar25);
            std::__detail::_List_node_base::_M_hook(p_Var12);
            pCVar4[1].ID._M_dataplus._M_p = pCVar4[1].ID._M_dataplus._M_p + 1;
            lVar25 = lVar25 + 0xc;
            lVar13 = lVar13 + -1;
          } while (lVar13 != 0);
        }
        local_1a0 = local_1a0 + 1;
      } while (local_1a0 != local_138);
    }
    pXVar7 = local_a0;
    iVar10 = (*(((local_a0->mReader)._M_t.
                 super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                 super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
               super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    pCVar4 = local_130;
    if ((char)iVar10 == '\0') {
      _local_1c8 = (aiVector2t<float>)local_1b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"Extrusion","");
      ParseNode_Metadata(pXVar7,pCVar4,(string *)local_1c8);
      if (_local_1c8 != (aiVector2t<float>)local_1b8) {
        operator_delete((void *)_local_1c8);
      }
    }
    else {
      pCVar4 = pXVar7->NodeElement_Cur;
      p_Var12 = (_List_node_base *)operator_new(0x18);
      p_Var12[1]._M_next = (_List_node_base *)local_130;
      std::__detail::_List_node_base::_M_hook(p_Var12);
      psVar1 = &(pCVar4->Child).
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    p_Var12 = (_List_node_base *)operator_new(0x18);
    p_Var12[1]._M_next = (_List_node_base *)local_130;
    std::__detail::_List_node_base::_M_hook(p_Var12);
    psVar1 = &(pXVar7->NodeElement_List).
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    std::
    vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
    ::~vector(&local_b8);
    if (local_118.super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118.
                      super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    XML_CheckNode_MustBeEmpty(this);
    if (local_70._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar8 = FindNodeElement(this,&local_50,ENET_Extrusion,&local_130);
    if (!bVar8) {
      Throw_USE_NotFound(this,&local_50);
    }
    pCVar4 = this->NodeElement_Cur;
    p_Var12 = (_List_node_base *)operator_new(0x18);
    p_Var12[1]._M_next = (_List_node_base *)local_130;
    std::__detail::_List_node_base::_M_hook(p_Var12);
    psVar1 = &(pCVar4->Child).
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  if (local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (aiVector2t<float> *)0x0) {
    operator_delete(local_f8.
                    super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((aiVector2t<float> *)
      local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (aiVector2t<float> *)0x0) {
    operator_delete(local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_178.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.
                    super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
LAB_006a7831:
  if (local_178.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start + uVar19 !=
      local_178.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_178.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_178.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
         _M_impl.super__Vector_impl_data._M_start + uVar19;
  }
  local_160 = CONCAT71((int7)((ulong)lVar13 >> 8),1);
  if (!(bool)(uVar23 < uVar21 & bVar8)) goto LAB_006a7859;
  goto LAB_006a77ba;
}

Assistant:

void X3DImporter::ParseNode_Geometry3D_Extrusion()
{
    std::string use, def;
    bool beginCap = true;
    bool ccw = true;
    bool convex = true;
    float creaseAngle = 0;
    std::vector<aiVector2D> crossSection;
    bool endCap = true;
    std::vector<float> orientation;
    std::vector<aiVector2D> scale;
    bool solid = true;
    std::vector<aiVector3D> spine;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("beginCap", beginCap, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("ccw", ccw, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("convex", convex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("creaseAngle", creaseAngle, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_REF("crossSection", crossSection, XML_ReadNode_GetAttrVal_AsArrVec2f);
		MACRO_ATTRREAD_CHECK_RET("endCap", endCap, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_REF("orientation", orientation, XML_ReadNode_GetAttrVal_AsArrF);
		MACRO_ATTRREAD_CHECK_REF("scale", scale, XML_ReadNode_GetAttrVal_AsArrVec2f);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_REF("spine", spine, XML_ReadNode_GetAttrVal_AsArrVec3f);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Extrusion, ne);
	}
	else
	{
		//
		// check if default values must be assigned
		//
		if(spine.size() == 0)
		{
			spine.resize(2);
			spine[0].Set(0, 0, 0), spine[1].Set(0, 1, 0);
		}
		else if(spine.size() == 1)
		{
			throw DeadlyImportError("ParseNode_Geometry3D_Extrusion. Spine must have at least two points.");
		}

		if(crossSection.size() == 0)
		{
			crossSection.resize(5);
			crossSection[0].Set(1, 1), crossSection[1].Set(1, -1), crossSection[2].Set(-1, -1), crossSection[3].Set(-1, 1), crossSection[4].Set(1, 1);
		}

		{// orientation
			size_t ori_size = orientation.size() / 4;

			if(ori_size < spine.size())
			{
				float add_ori[4];// values that will be added

				if(ori_size == 1)// if "orientation" has one element(means one MFRotation with four components) then use it value for all spine points.
				{
					add_ori[0] = orientation[0], add_ori[1] = orientation[1], add_ori[2] = orientation[2], add_ori[3] = orientation[3];
				}
				else// else - use default values
				{
					add_ori[0] = 0, add_ori[1] = 0, add_ori[2] = 1, add_ori[3] = 0;
				}

				orientation.reserve(spine.size() * 4);
				for(size_t i = 0, i_e = (spine.size() - ori_size); i < i_e; i++)
					orientation.push_back(add_ori[0]), orientation.push_back(add_ori[1]), orientation.push_back(add_ori[2]), orientation.push_back(add_ori[3]);
			}

			if(orientation.size() % 4) throw DeadlyImportError("Attribute \"orientation\" in <Extrusion> must has multiple four quantity of numbers.");
		}// END: orientation

		{// scale
			if(scale.size() < spine.size())
			{
				aiVector2D add_sc;

				if(scale.size() == 1)// if "scale" has one element then use it value for all spine points.
					add_sc = scale[0];
				else// else - use default values
					add_sc.Set(1, 1);

				scale.reserve(spine.size());
				for(size_t i = 0, i_e = (spine.size() - scale.size()); i < i_e; i++) scale.push_back(add_sc);
			}
		}// END: scale
		//
		// create and if needed - define new geometry object.
		//
		ne = new CX3DImporter_NodeElement_IndexedSet(CX3DImporter_NodeElement::ENET_Extrusion, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		CX3DImporter_NodeElement_IndexedSet& ext_alias = *((CX3DImporter_NodeElement_IndexedSet*)ne);// create alias for conveience
		// assign part of input data
		ext_alias.CCW = ccw;
		ext_alias.Convex = convex;
		ext_alias.CreaseAngle = creaseAngle;
		ext_alias.Solid = solid;

		//
		// How we done it at all?
		// 1. At first we will calculate array of basises for every point in spine(look SCP in ISO-dic). Also "orientation" vector
		// are applied vor every basis.
		// 2. After that we can create array of point sets: which are scaled, transferred to basis of relative basis and at final translated to real position
		// using relative spine point.
		// 3. Next step is creating CoordIdx array(do not forget "-1" delimiter). While creating CoordIdx also created faces for begin and end caps, if
		// needed. While createing CootdIdx is taking in account CCW flag.
		// 4. The last step: create Vertices list.
		//
        bool spine_closed;// flag: true if spine curve is closed.
        bool cross_closed;// flag: true if cross curve is closed.
        std::vector<aiMatrix3x3> basis_arr;// array of basises. ROW_a - X, ROW_b - Y, ROW_c - Z.
        std::vector<std::vector<aiVector3D> > pointset_arr;// array of point sets: cross curves.

        // detect closed curves
        GeometryHelper_Extrusion_CurveIsClosed(crossSection, true, true, cross_closed);// true - drop tail, true - remove duplicate end.
        GeometryHelper_Extrusion_CurveIsClosed(spine, true, true, spine_closed);// true - drop tail, true - remove duplicate end.
        // If both cap are requested and spine curve is closed then we can make only one cap. Because second cap will be the same surface.
        if(spine_closed)
        {
			beginCap |= endCap;
			endCap = false;
		}

        {// 1. Calculate array of basises.
			aiMatrix4x4 rotmat;
			aiVector3D vecX(0), vecY(0), vecZ(0);

			basis_arr.resize(spine.size());
			for(size_t i = 0, i_e = spine.size(); i < i_e; i++)
			{
				aiVector3D tvec;

				// get axises of basis.
				vecY = GeometryHelper_Extrusion_GetNextY(i, spine, spine_closed);
				vecZ = GeometryHelper_Extrusion_GetNextZ(i, spine, spine_closed, vecZ);
				vecX = (vecY ^ vecZ).Normalize();
				// get rotation matrix and apply "orientation" to basis
				aiMatrix4x4::Rotation(orientation[i * 4 + 3], aiVector3D(orientation[i * 4], orientation[i * 4 + 1], orientation[i * 4 + 2]), rotmat);
				tvec = vecX, tvec *= rotmat, basis_arr[i].a1 = tvec.x, basis_arr[i].a2 = tvec.y, basis_arr[i].a3 = tvec.z;
				tvec = vecY, tvec *= rotmat, basis_arr[i].b1 = tvec.x, basis_arr[i].b2 = tvec.y, basis_arr[i].b3 = tvec.z;
				tvec = vecZ, tvec *= rotmat, basis_arr[i].c1 = tvec.x, basis_arr[i].c2 = tvec.y, basis_arr[i].c3 = tvec.z;
			}// for(size_t i = 0, i_e = spine.size(); i < i_e; i++)
		}// END: 1. Calculate array of basises

		{// 2. Create array of point sets.
			aiMatrix4x4 scmat;
			std::vector<aiVector3D> tcross(crossSection.size());

			pointset_arr.resize(spine.size());
			for(size_t spi = 0, spi_e = spine.size(); spi < spi_e; spi++)
			{
				aiVector3D tc23vec;

				tc23vec.Set(scale[spi].x, 0, scale[spi].y);
				aiMatrix4x4::Scaling(tc23vec, scmat);
				for(size_t cri = 0, cri_e = crossSection.size(); cri < cri_e; cri++)
				{
					aiVector3D tvecX, tvecY, tvecZ;

					tc23vec.Set(crossSection[cri].x, 0, crossSection[cri].y);
					// apply scaling to point
					tcross[cri] = scmat * tc23vec;
					//
					// transfer point to new basis
					// calculate coordinate in new basis
					tvecX.Set(basis_arr[spi].a1, basis_arr[spi].a2, basis_arr[spi].a3), tvecX *= tcross[cri].x;
					tvecY.Set(basis_arr[spi].b1, basis_arr[spi].b2, basis_arr[spi].b3), tvecY *= tcross[cri].y;
					tvecZ.Set(basis_arr[spi].c1, basis_arr[spi].c2, basis_arr[spi].c3), tvecZ *= tcross[cri].z;
					// apply new coordinates and translate it to spine point.
					tcross[cri] = tvecX + tvecY + tvecZ + spine[spi];
				}// for(size_t cri = 0, cri_e = crossSection.size(); cri < cri_e; i++)

				pointset_arr[spi] = tcross;// store transferred point set
			}// for(size_t spi = 0, spi_e = spine.size(); spi < spi_e; i++)
		}// END: 2. Create array of point sets.

		{// 3. Create CoordIdx.
			// add caps if needed
			if(beginCap)
			{
				// add cap as polygon. vertices of cap are places at begin, so just add numbers from zero.
				for(size_t i = 0, i_e = crossSection.size(); i < i_e; i++) ext_alias.CoordIndex.push_back(static_cast<int32_t>(i));

				// add delimiter
				ext_alias.CoordIndex.push_back(-1);
			}// if(beginCap)

			if(endCap)
			{
				// add cap as polygon. vertices of cap are places at end, as for beginCap use just sequence of numbers but with offset.
				size_t beg = (pointset_arr.size() - 1) * crossSection.size();

				for(size_t i = beg, i_e = (beg + crossSection.size()); i < i_e; i++) ext_alias.CoordIndex.push_back(static_cast<int32_t>(i));

				// add delimiter
				ext_alias.CoordIndex.push_back(-1);
			}// if(beginCap)

			// add quads
			for(size_t spi = 0, spi_e = (spine.size() - 1); spi <= spi_e; spi++)
			{
				const size_t cr_sz = crossSection.size();
				const size_t cr_last = crossSection.size() - 1;

				size_t right_col;// hold index basis for points of quad placed in right column;

				if(spi != spi_e)
					right_col = spi + 1;
				else if(spine_closed)// if spine curve is closed then one more quad is needed: between first and last points of curve.
					right_col = 0;
				else
					break;// if spine curve is not closed then break the loop, because spi is out of range for that type of spine.

				for(size_t cri = 0; cri < cr_sz; cri++)
				{
					if(cri != cr_last)
					{
						MACRO_FACE_ADD_QUAD(ccw, ext_alias.CoordIndex,
											static_cast<int32_t>(spi * cr_sz + cri), 
                                            static_cast<int32_t>(right_col * cr_sz + cri), 
                                            static_cast<int32_t>(right_col * cr_sz + cri + 1), 
                                            static_cast<int32_t>(spi * cr_sz + cri + 1));
						// add delimiter
						ext_alias.CoordIndex.push_back(-1);
					}
					else if(cross_closed)// if cross curve is closed then one more quad is needed: between first and last points of curve.
					{
						MACRO_FACE_ADD_QUAD(ccw, ext_alias.CoordIndex,
                                            static_cast<int32_t>(spi * cr_sz + cri), 
                                            static_cast<int32_t>(right_col * cr_sz + cri), 
                                            static_cast<int32_t>(right_col * cr_sz + 0), 
                                            static_cast<int32_t>(spi * cr_sz + 0));
						// add delimiter
						ext_alias.CoordIndex.push_back(-1);
					}
				}// for(size_t cri = 0; cri < cr_sz; cri++)
			}// for(size_t spi = 0, spi_e = (spine.size() - 2); spi < spi_e; spi++)
		}// END: 3. Create CoordIdx.

		{// 4. Create vertices list.
			// just copy all vertices
			for(size_t spi = 0, spi_e = spine.size(); spi < spi_e; spi++)
			{
				for(size_t cri = 0, cri_e = crossSection.size(); cri < cri_e; cri++)
				{
					ext_alias.Vertices.push_back(pointset_arr[spi][cri]);
				}
			}
		}// END: 4. Create vertices list.
//PrintVectorSet("Ext. CoordIdx", ext_alias.CoordIndex);
//PrintVectorSet("Ext. Vertices", ext_alias.Vertices);
		// check for child nodes
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "Extrusion");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}